

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR cast_string_recursive
                 (lyd_node *node,lyxp_set *set,uint32_t indent,char **str,uint32_t *used,
                 uint32_t *size)

{
  uint16_t uVar1;
  int iVar2;
  ly_ctx *plVar3;
  uint uVar4;
  uint32_t *used_00;
  LY_ERR LVar5;
  uint32_t uVar6;
  lysc_node *plVar7;
  lyd_node *plVar8;
  char *pcVar9;
  size_t sVar10;
  LY_ERR ret__;
  char *buf;
  ulong local_60;
  uint32_t *local_58;
  lyxp_node_type child_type;
  undefined4 uStack_4c;
  ly_out *out;
  char *ptr;
  uint32_t *local_38;
  
  ptr = (char *)0x0;
  if ((node == (lyd_node *)0x0) || (set->root_type != LYXP_NODE_ROOT_CONFIG)) {
    if (node == (lyd_node *)0x0) {
      LVar5 = cast_string_realloc(set->ctx,1,str,used,size);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      pcVar9 = *str;
      uVar6 = *used;
      (pcVar9 + (uVar6 - 1))[0] = '\n';
      (pcVar9 + (uVar6 - 1))[1] = '\0';
      *used = *used + 1;
      buf = (char *)0x0;
      child_type = LYXP_NODE_NONE;
      while (LVar5 = moveto_axis_node_next
                               ((lyd_node **)&buf,&child_type,(lyd_node *)0x0,set->root_type,
                                LYXP_AXIS_CHILD,set), LVar5 == LY_SUCCESS) {
        LVar5 = cast_string_recursive((lyd_node *)buf,set,indent + 1,str,used,size);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
      }
      LVar5 = cast_string_realloc(set->ctx,1,str,used,size);
      if (LVar5 == LY_SUCCESS) {
        pcVar9 = *str;
        uVar6 = *used;
        (pcVar9 + (uVar6 - 1))[0] = '\n';
        (pcVar9 + (uVar6 - 1))[1] = '\0';
        *used = *used + 1;
        return LY_SUCCESS;
      }
      return LVar5;
    }
    plVar7 = node->schema;
    if (plVar7 != (lysc_node *)0x0) goto LAB_001a84cc;
  }
  else {
    plVar7 = node->schema;
    if (plVar7 != (lysc_node *)0x0) {
      if ((plVar7->flags & 2) != 0) {
        return LY_SUCCESS;
      }
LAB_001a84cc:
      uVar1 = plVar7->nodetype;
      if (uVar1 == 1) goto LAB_001a8549;
      if ((uVar1 == 4) || (uVar1 == 8)) goto LAB_001a85df;
      if (uVar1 == 0x10) goto LAB_001a8549;
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
        if ((uVar1 != 0x400) && (uVar1 != 0x100)) {
          ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0x259);
          return LY_EINT;
        }
        goto LAB_001a8549;
      }
      if (*(char **)(node + 1) == (char *)0x0) {
        pcVar9 = "";
LAB_001a878b:
        buf = strdup(pcVar9);
        pcVar9 = buf;
        if (buf == (char *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "cast_string_recursive");
          return LY_EMEM;
        }
      }
      else {
        iVar2 = *(int *)&node[1].schema;
        if (iVar2 == 4) {
          LVar5 = lyd_parse_data_mem(set->ctx,*(char **)(node + 1),LYD_LYB,0x30000,0,
                                     (lyd_node **)&child_type);
          if (LVar5 != LY_SUCCESS) {
            iVar2 = *(int *)&node[1].schema;
            goto LAB_001a8715;
          }
          free(*(void **)(node + 1));
          node[1].hash = child_type;
          node[1].flags = uStack_4c;
          *(undefined4 *)&node[1].schema = 0;
        }
        else {
LAB_001a8715:
          if (iVar2 - 1U < 3) {
            pcVar9 = *(char **)(node + 1);
            goto LAB_001a878b;
          }
          if (iVar2 != 0) {
            pcVar9 = (char *)(ulong)(iVar2 - 1U);
            if (iVar2 == 4) {
              ly_log(set->ctx,LY_LLERR,LY_EINVAL,"Cannot convert LYB anydata into string.");
              return LY_EINVAL;
            }
            goto LAB_001a879d;
          }
        }
        local_58 = size;
        LVar5 = ly_out_new_memory(&buf,0,&out);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        LVar5 = lyd_print_all(out,*(lyd_node **)(node + 1),LYD_XML,0);
        ly_out_free(out,(_func_void_void_ptr *)0x0,'\0');
        pcVar9 = buf;
        size = local_58;
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
      }
LAB_001a879d:
      local_58 = size;
      pcVar9 = strtok_r(pcVar9,"\n",&ptr);
      uVar4 = indent * 2;
      local_60 = (ulong)uVar4 + 1;
      do {
        plVar3 = set->ctx;
        sVar10 = strlen(pcVar9);
        LVar5 = cast_string_realloc(plVar3,sVar10 + local_60,str,used,local_58);
        if (LVar5 != LY_SUCCESS) {
          free(buf);
          return LVar5;
        }
        memset(*str + (*used - 1),0x20,(ulong)uVar4);
        uVar6 = *used;
        *used = uVar6 + uVar4;
        strcpy(*str + ((uVar6 + uVar4) - 1),pcVar9);
        sVar10 = strlen(pcVar9);
        uVar6 = *used;
        *used = uVar6 + (int)sVar10;
        pcVar9 = *str;
        (pcVar9 + (((int)sVar10 + uVar6) - 1))[0] = '\n';
        (pcVar9 + (((int)sVar10 + uVar6) - 1))[1] = '\0';
        *used = *used + 1;
        pcVar9 = strtok_r((char *)0x0,"\n",&ptr);
      } while (pcVar9 != (char *)0x0);
      free(buf);
      return LY_SUCCESS;
    }
  }
  plVar8 = lyd_child(node);
  if (plVar8 != (lyd_node *)0x0) {
LAB_001a8549:
    local_60 = (ulong)indent;
    local_38 = used;
    LVar5 = cast_string_realloc(set->ctx,1,str,used,size);
    used_00 = local_38;
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    pcVar9 = *str;
    uVar6 = *local_38;
    (pcVar9 + (uVar6 - 1))[0] = '\n';
    (pcVar9 + (uVar6 - 1))[1] = '\0';
    *local_38 = *local_38 + 1;
    plVar8 = lyd_child(node);
    local_60 = (ulong)((int)local_60 + 1);
    while( true ) {
      if (plVar8 == (lyd_node *)0x0) {
        return LY_SUCCESS;
      }
      LVar5 = cast_string_recursive(plVar8,set,(uint32_t)local_60,str,used_00,size);
      if (LVar5 != LY_SUCCESS) break;
      plVar8 = plVar8->next;
    }
    return LVar5;
  }
LAB_001a85df:
  pcVar9 = lyd_get_value(node);
  plVar3 = set->ctx;
  uVar4 = indent * 2;
  sVar10 = strlen(pcVar9);
  LVar5 = cast_string_realloc(plVar3,sVar10 + uVar4 + 1,str,used,size);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  memset(*str + (*used - 1),0x20,(ulong)uVar4);
  uVar6 = *used + uVar4;
  *used = uVar6;
  if (uVar6 == 1) {
    strcpy(*str,pcVar9);
    sVar10 = strlen(pcVar9);
    *used = *used + (int)sVar10;
    return LY_SUCCESS;
  }
  sprintf(*str + (uVar6 - 1),"%s\n",pcVar9);
  sVar10 = strlen(pcVar9);
  *used = (int)sVar10 + *used + 1;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
cast_string_recursive(const struct lyd_node *node, struct lyxp_set *set, uint32_t indent, char **str, uint32_t *used,
        uint32_t *size)
{
    char *buf, *line, *ptr = NULL;
    const char *value_str;
    uint16_t nodetype;
    const struct lyd_node *child;
    enum lyxp_node_type child_type;
    struct lyd_node *tree;
    struct lyd_node_any *any;
    LY_ERR rc;

    if ((set->root_type == LYXP_NODE_ROOT_CONFIG) && node && node->schema && (node->schema->flags & LYS_CONFIG_R)) {
        return LY_SUCCESS;
    }

    if (!node) {
        /* fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        ++indent;

        /* print all the top-level nodes */
        child = NULL;
        child_type = 0;
        while (!moveto_axis_node_next(&child, &child_type, NULL, set->root_type, LYXP_AXIS_CHILD, set)) {
            LY_CHECK_RET(cast_string_recursive(child, set, indent, str, used, size));
        }

        /* end fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        --indent;
    } else {
        if (node->schema) {
            nodetype = node->schema->nodetype;
        } else if (lyd_child(node)) {
            nodetype = LYS_CONTAINER;
        } else {
            nodetype = LYS_LEAF;
        }

        switch (nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_RPC:
        case LYS_NOTIF:
            LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
            strcpy(*str + (*used - 1), "\n");
            ++(*used);

            for (child = lyd_child(node); child; child = child->next) {
                LY_CHECK_RET(cast_string_recursive(child, set, indent + 1, str, used, size));
            }

            break;

        case LYS_LEAF:
        case LYS_LEAFLIST:
            value_str = lyd_get_value(node);

            /* print indent */
            LY_CHECK_RET(cast_string_realloc(set->ctx, indent * 2 + strlen(value_str) + 1, str, used, size));
            memset(*str + (*used - 1), ' ', indent * 2);
            *used += indent * 2;

            /* print value */
            if (*used == 1) {
                sprintf(*str + (*used - 1), "%s", value_str);
                *used += strlen(value_str);
            } else {
                sprintf(*str + (*used - 1), "%s\n", value_str);
                *used += strlen(value_str) + 1;
            }

            break;

        case LYS_ANYXML:
        case LYS_ANYDATA:
            any = (struct lyd_node_any *)node;
            if (!(void *)any->value.tree) {
                /* no content */
                buf = strdup("");
                LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
            } else {
                struct ly_out *out;

                if (any->value_type == LYD_ANYDATA_LYB) {
                    /* try to parse it into a data tree */
                    if (lyd_parse_data_mem((struct ly_ctx *)set->ctx, any->value.mem, LYD_LYB,
                            LYD_PARSE_ONLY | LYD_PARSE_STRICT, 0, &tree) == LY_SUCCESS) {
                        /* successfully parsed */
                        free(any->value.mem);
                        any->value.tree = tree;
                        any->value_type = LYD_ANYDATA_DATATREE;
                    }
                    /* error is covered by the following switch where LYD_ANYDATA_LYB causes failure */
                }

                switch (any->value_type) {
                case LYD_ANYDATA_STRING:
                case LYD_ANYDATA_XML:
                case LYD_ANYDATA_JSON:
                    buf = strdup(any->value.json);
                    LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
                    break;
                case LYD_ANYDATA_DATATREE:
                    LY_CHECK_RET(ly_out_new_memory(&buf, 0, &out));
                    rc = lyd_print_all(out, any->value.tree, LYD_XML, 0);
                    ly_out_free(out, NULL, 0);
                    LY_CHECK_RET(rc);
                    break;
                case LYD_ANYDATA_LYB:
                    LOGERR(set->ctx, LY_EINVAL, "Cannot convert LYB anydata into string.");
                    return LY_EINVAL;
                }
            }

            line = strtok_r(buf, "\n", &ptr);
            do {
                rc = cast_string_realloc(set->ctx, indent * 2 + strlen(line) + 1, str, used, size);
                if (rc != LY_SUCCESS) {
                    free(buf);
                    return rc;
                }
                memset(*str + (*used - 1), ' ', indent * 2);
                *used += indent * 2;

                strcpy(*str + (*used - 1), line);
                *used += strlen(line);

                strcpy(*str + (*used - 1), "\n");
                *used += 1;
            } while ((line = strtok_r(NULL, "\n", &ptr)));

            free(buf);
            break;

        default:
            LOGINT_RET(set->ctx);
        }
    }

    return LY_SUCCESS;
}